

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O0

int * Gia_ManGigCount(Vec_Int_t *vObjs,Vec_Int_t *vStore)

{
  int iVar1;
  int local_1c;
  int i;
  Vec_Int_t *vStore_local;
  Vec_Int_t *vObjs_local;
  
  for (local_1c = 0; local_1c < 10; local_1c = local_1c + 1) {
    Gia_ManGigCount::nObjs[local_1c] = 0;
  }
  local_1c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vObjs);
    if (iVar1 <= local_1c) break;
    iVar1 = Vec_IntEntry(vObjs,local_1c);
    iVar1 = Vec_IntEntry(vStore,iVar1 + 1);
    Gia_ManGigCount::nObjs[iVar1] = Gia_ManGigCount::nObjs[iVar1] + 1;
    local_1c = local_1c + 1;
  }
  return Gia_ManGigCount::nObjs;
}

Assistant:

int * Gia_ManGigCount( Vec_Int_t * vObjs, Vec_Int_t * vStore )
{
    static int nObjs[GIG_UNUSED]; int i;
    for ( i = 0; i < GIG_UNUSED; i++ )
        nObjs[i] = 0;
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
        nObjs[Vec_IntEntry(vStore, Vec_IntEntry(vObjs,i) + 1)]++;
    return nObjs;
}